

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e)

{
  IntPoint *pt;
  TEdge *e2;
  TEdge *e_00;
  clipperException *this_00;
  
  e_00 = GetMaximaPairEx(e);
  if (e_00 == (TEdge *)0x0) {
    e_00 = e;
    if (-1 < e->OutIdx) {
      AddOutPt(this,e,&e->Top);
    }
    goto LAB_00117999;
  }
  pt = &e->Top;
  while ((e2 = e->NextInAEL, e2 != (TEdge *)0x0 && (e2 != e_00))) {
    IntersectEdges(this,e,e2,pt);
    ClipperBase::SwapPositionsInAEL
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e,e2);
  }
  if (e->OutIdx == -1) {
    if (e_00->OutIdx == -1) {
LAB_0011793c:
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e);
      goto LAB_00117999;
    }
LAB_00117933:
    if (e->WindDelta != 0) {
LAB_001179b4:
      this_00 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(this_00,"DoMaxima error");
      __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
    }
  }
  else {
    if (e->OutIdx < 0) goto LAB_00117933;
    if (-1 < e_00->OutIdx) {
      AddLocalMaxPoly(this,e,e_00,pt);
      goto LAB_0011793c;
    }
    if (e->WindDelta != 0) goto LAB_001179b4;
    AddOutPt(this,e,pt);
    e->OutIdx = -1;
  }
  ClipperBase::DeleteFromAEL
            ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e);
  if (-1 < e_00->OutIdx) {
    AddOutPt(this,e_00,pt);
    e_00->OutIdx = -1;
  }
LAB_00117999:
  ClipperBase::DeleteFromAEL
            ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e_00);
  return;
}

Assistant:

void Clipper::DoMaxima(TEdge *e)
{
  TEdge* eMaxPair = GetMaximaPairEx(e);
  if (!eMaxPair)
  {
    if (e->OutIdx >= 0)
      AddOutPt(e, e->Top);
    DeleteFromAEL(e);
    return;
  }

  TEdge* eNext = e->NextInAEL;
  while(eNext && eNext != eMaxPair)
  {
    IntersectEdges(e, eNext, e->Top);
    SwapPositionsInAEL(e, eNext);
    eNext = e->NextInAEL;
  }

  if(e->OutIdx == Unassigned && eMaxPair->OutIdx == Unassigned)
  {
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
  else if( e->OutIdx >= 0 && eMaxPair->OutIdx >= 0 )
  {
    if (e->OutIdx >= 0) AddLocalMaxPoly(e, eMaxPair, e->Top);
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
#ifdef use_lines
  else if (e->WindDelta == 0)
  {
    if (e->OutIdx >= 0) 
    {
      AddOutPt(e, e->Top);
      e->OutIdx = Unassigned;
    }
    DeleteFromAEL(e);

    if (eMaxPair->OutIdx >= 0)
    {
      AddOutPt(eMaxPair, e->Top);
      eMaxPair->OutIdx = Unassigned;
    }
    DeleteFromAEL(eMaxPair);
  } 
#endif
  else throw clipperException("DoMaxima error");
}